

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall
QListModel::ensureSorted(QListModel *this,int column,SortOrder order,int start,int end)

{
  QListWidgetItem **ppQVar1;
  char cVar2;
  ulong uVar3;
  QListWidgetItem **ppQVar4;
  QListWidgetItem **ppQVar5;
  long lVar6;
  long lVar7;
  code *pcVar8;
  
  if (column == 0) {
    uVar3 = 1;
    if (1 < start) {
      uVar3 = (ulong)(uint)start;
    }
    ppQVar1 = (this->items).d.ptr;
    lVar7 = (this->items).d.size;
    lVar6 = (long)(end + 2);
    if (lVar7 < end + 2) {
      lVar6 = lVar7;
    }
    ppQVar5 = ppQVar1 + (uVar3 - 1);
    ppQVar1 = ppQVar1 + lVar6;
    pcVar8 = ensureSorted::anon_class_1_0_00000001::__invoke;
    if (order == AscendingOrder) {
      pcVar8 = ensureSorted::anon_class_1_0_00000001::__invoke;
    }
    if (ppQVar5 != ppQVar1) {
      lVar7 = lVar6 * 8 + uVar3 * -8;
      ppQVar4 = ppQVar5;
      do {
        if (lVar7 == 0) {
          return;
        }
        ppQVar5 = ppQVar4 + 1;
        cVar2 = (*pcVar8)(ppQVar4[1],*ppQVar4);
        lVar7 = lVar7 + -8;
        ppQVar4 = ppQVar5;
      } while (cVar2 == '\0');
    }
    if (ppQVar5 != ppQVar1) {
      (**(code **)(*(long *)this + 0x140))(this,0,order);
      return;
    }
  }
  return;
}

Assistant:

void QListModel::ensureSorted(int column, Qt::SortOrder order, int start, int end)
{
    if (column != 0)
        return;

    const auto compareLt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *left < *right;
    };

    const auto compareGt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *right < *left;
    };

    /** Check if range [start,end] is already in sorted position in list.
     *  Take for this the assumption, that outside [start,end] the list
     *  is already sorted. Therefore the sorted check has to be extended
     *  to the first element that is known to be sorted before the range
     *  [start, end], which is (start-1) and the first element after the
     *  range [start, end], which is (end+2) due to end being included.
    */
    const auto beginChangedIterator = items.constBegin() + qMax(start - 1, 0);
    const auto endChangedIterator = items.constBegin() + qMin(end + 2, items.size());
    const bool needsSorting = !std::is_sorted(beginChangedIterator, endChangedIterator,
                                              order == Qt::AscendingOrder ? compareLt : compareGt);

    if (needsSorting)
        sort(column, order);
}